

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedExecution.h
# Opt level: O3

void nrg::TimedExecution::push<void(*)(int,std::__cxx11::string_const&),int&,char_const(&)[7]>
               (Queue *queue,
               _func_void_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               *fn,int *param,char (*param_4) [7])

{
  int iVar1;
  undefined4 uVar2;
  duration dVar3;
  QueueElement local_80;
  rep local_58;
  undefined8 *local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 uStack_38;
  
  dVar3.__r = std::chrono::_V2::steady_clock::now();
  iVar1 = *param;
  local_48 = 0;
  local_58 = dVar3.__r;
  local_80.what.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
  *(_func_void_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **)
   local_80.what.super__Function_base._M_functor._M_unused._0_8_ = fn;
  *(int *)((long)local_80.what.super__Function_base._M_functor._M_unused._0_8_ + 8) = iVar1;
  uVar2 = *(undefined4 *)(*param_4 + 3);
  *(undefined4 *)((long)local_80.what.super__Function_base._M_functor._M_unused._0_8_ + 0xc) =
       *(undefined4 *)*param_4;
  *(undefined4 *)((long)local_80.what.super__Function_base._M_functor._M_unused._0_8_ + 0xf) = uVar2
  ;
  local_80.what._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/TimedExecution.h:74:38)>
       ::_M_invoke;
  local_80.what.super__Function_base._M_functor._8_8_ = local_48;
  local_80.what.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/TimedExecution.h:74:38)>
       ::_M_manager;
  local_40 = (code *)0x0;
  uStack_38 = 0;
  local_80.when.__d.__r = (duration)(duration)dVar3.__r;
  local_50 = (undefined8 *)local_80.what.super__Function_base._M_functor._M_unused._0_8_;
  std::vector<nrg::TimedExecution::QueueElement,_std::allocator<nrg::TimedExecution::QueueElement>_>
  ::emplace_back<nrg::TimedExecution::QueueElement>(&queue->c,&local_80);
  std::
  push_heap<__gnu_cxx::__normal_iterator<nrg::TimedExecution::QueueElement*,std::vector<nrg::TimedExecution::QueueElement,std::allocator<nrg::TimedExecution::QueueElement>>>,std::greater<nrg::TimedExecution::QueueElement>>
            ((queue->c).
             super__Vector_base<nrg::TimedExecution::QueueElement,_std::allocator<nrg::TimedExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (queue->c).
             super__Vector_base<nrg::TimedExecution::QueueElement,_std::allocator<nrg::TimedExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_80.what.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_80.what.super__Function_base._M_manager)
              ((_Any_data *)&local_80.what,(_Any_data *)&local_80.what,__destroy_functor);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = { now(), [=]() { fn(param...); } };
        push(queue, std::move(elem));
    }